

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aco_solver.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  time_t tVar6;
  ostream *poVar7;
  ACS *this;
  int n;
  int i;
  long lVar8;
  int step_intensity;
  uint __seed;
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  initializer_list<args::EitherFlag> in_01;
  initializer_list<args::EitherFlag> in_02;
  initializer_list<args::EitherFlag> in_03;
  initializer_list<args::EitherFlag> in_04;
  initializer_list<args::EitherFlag> in_05;
  initializer_list<args::EitherFlag> in_06;
  initializer_list<args::EitherFlag> in_07;
  initializer_list<args::EitherFlag> in_08;
  initializer_list<args::EitherFlag> in_09;
  initializer_list<args::EitherFlag> in_10;
  initializer_list<args::EitherFlag> in_11;
  initializer_list<args::EitherFlag> in_12;
  initializer_list<args::EitherFlag> in_13;
  initializer_list<args::EitherFlag> in_14;
  initializer_list<args::EitherFlag> in_15;
  initializer_list<args::EitherFlag> in_16;
  initializer_list<args::EitherFlag> in_17;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  allocator local_1525;
  int local_1524;
  int local_1520;
  allocator local_1519;
  vector<double,_std::allocator<double>_> Zmin;
  vector<double,_std::allocator<double>_> w;
  vector<double,_std::allocator<double>_> Zmax;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> volumes;
  double local_1490;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _path;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _file;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _file2;
  Collimator collimator;
  string file;
  _Vector_base<double,_std::allocator<double>_> local_fd8;
  _Vector_base<double,_std::allocator<double>_> local_fc0;
  _Vector_base<double,_std::allocator<double>_> local_fa8;
  string path;
  string file2;
  string local_f50;
  string local_f30;
  string local_f10;
  ValueFlag<double,_args::ValueReader<double>_> _beta;
  ValueFlag<double,_args::ValueReader<double>_> _alpha;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_d40;
  ValueFlag<int,_args::ValueReader<int>_> _step_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _max_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _initial_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _max_apertures;
  ValueFlag<int,_args::ValueReader<int>_> _seed;
  ValueFlag<int,_args::ValueReader<int>_> _maxtime;
  ValueFlag<int,_args::ValueReader<int>_> _maxiter;
  ValueFlag<int,_args::ValueReader<int>_> _open_apertures;
  Flag _plot;
  ArgumentParser parser;
  ValueFlag<int,_args::ValueReader<int>_> _maxratio;
  ValueFlag<int,_args::ValueReader<int>_> _maxdelta;
  ValueFlag<int,_args::ValueReader<int>_> _vsize;
  ValueFlag<int,_args::ValueReader<int>_> _bsize;
  HelpFlag help;
  
  std::__cxx11::string::string
            ((string *)&file,"data/testinstance_0_70_140_210_280.txt",(allocator *)&collimator);
  std::__cxx11::string::string
            ((string *)&file2,"data/test_instance_coordinates.txt",(allocator *)&collimator);
  std::__cxx11::string::string((string *)&path,".",(allocator *)&collimator);
  tVar6 = time((time_t *)0x0);
  std::__cxx11::string::string
            ((string *)&collimator,"********* IMRT-Solver (ACO solver) *********",
             (allocator *)&_file2);
  std::__cxx11::string::string
            ((string *)&_file,
             "Example.\n./ACO -s ibo_ls --maxiter=400 --maxdelta=8 --maxratio=6 --alpha=0.999 --beta=0.999 --bsize=5 --vsize=20 --max-apertures=4 --seed=0 --open-apertures=1 --initial-intensity=4 --step-intensity=1 --file-dep=data/Equidistantes/equidist00.txt --file-coord=data/Equidistantes/equidist-coord.txt"
             ,(allocator *)&_path);
  args::ArgumentParser::ArgumentParser(&parser,(string *)&collimator,(string *)&_file);
  std::__cxx11::string::~string((string *)&_file);
  std::__cxx11::string::~string((string *)&collimator);
  std::__cxx11::string::string((string *)&_file2,"help",(allocator *)&_alpha);
  std::__cxx11::string::string((string *)&_path,"Display this help menu",(allocator *)&_beta);
  _file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._8_8_ =
       &_file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_string_length;
  _file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_2_ = 0x6801;
  _file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p =
       (pointer)0x0;
  _file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help._M_string_length._0_1_ =
       0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)
             ((long)&_file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help.
                     field_2 + 8),"help");
  in._M_len = 2;
  in._M_array = (iterator)&_file;
  args::Matcher::Matcher((Matcher *)&collimator,in);
  args::HelpFlag::HelpFlag
            (&help,&parser.super_Group,(string *)&_file2,(string *)&_path,(Matcher *)&collimator);
  args::Matcher::~Matcher((Matcher *)&collimator);
  lVar8 = 0x30;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&_file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                       _vptr_Base + lVar8));
    lVar8 = lVar8 + -0x28;
  } while (lVar8 != -0x20);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::string((string *)&_file2,"int",(allocator *)&_maxdelta);
  std::__cxx11::to_string((string *)&_beta,0x14);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_alpha,
                 "Number of considered beamlets for selection (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_beta);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_alpha,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&_file,"bsize");
  in_00._M_len = 1;
  in_00._M_array = (iterator)&_file;
  args::Matcher::Matcher((Matcher *)&collimator,in_00);
  _vsize.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_bsize,&parser.super_Group,(string *)&_file2,(string *)&_path,(Matcher *)&collimator,
             (int *)&_vsize,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched)
  ;
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_alpha);
  std::__cxx11::string::~string((string *)&_beta);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::string((string *)&_file2,"int",(allocator *)&_maxratio);
  std::__cxx11::to_string((string *)&_beta,0x32);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_alpha,
                 "Number of considered worst voxels (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_beta);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_alpha,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&_file,"vsize");
  in_01._M_len = 1;
  in_01._M_array = (iterator)&_file;
  args::Matcher::Matcher((Matcher *)&collimator,in_01);
  _maxdelta.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_vsize,&parser.super_Group,(string *)&_file2,(string *)&_path,(Matcher *)&collimator,
             (int *)&_maxdelta,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched)
  ;
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_alpha);
  std::__cxx11::string::~string((string *)&_beta);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::string((string *)&_file2,"int",(allocator *)&_maxiter);
  std::__cxx11::to_string((string *)&_beta,5.0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_alpha,
                 "Max delta  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_beta);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_alpha,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&_file,"maxdelta");
  in_02._M_len = 1;
  in_02._M_array = (iterator)&_file;
  args::Matcher::Matcher((Matcher *)&collimator,in_02);
  _maxratio.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_maxdelta,&parser.super_Group,(string *)&_file2,(string *)&_path,
             (Matcher *)&collimator,(int *)&_maxratio,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched)
  ;
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_alpha);
  std::__cxx11::string::~string((string *)&_beta);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::string((string *)&_file2,"int",(allocator *)&_maxtime);
  std::__cxx11::to_string((string *)&_beta,3.0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_alpha,
                 "Max ratio  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_beta);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_alpha,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&_file,"maxratio");
  in_03._M_len = 1;
  in_03._M_array = (iterator)&_file;
  args::Matcher::Matcher((Matcher *)&collimator,in_03);
  _maxiter.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_maxratio,&parser.super_Group,(string *)&_file2,(string *)&_path,
             (Matcher *)&collimator,(int *)&_maxiter,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched)
  ;
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_alpha);
  std::__cxx11::string::~string((string *)&_beta);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::string((string *)&_file2,"double",(allocator *)&_seed);
  std::__cxx11::to_string((string *)&_maxiter,1.0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_beta,
                 "Initial temperature for intensities  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_maxiter);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_beta,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&_file,"alpha");
  in_04._M_len = 1;
  in_04._M_array = (iterator)&_file;
  args::Matcher::Matcher((Matcher *)&collimator,in_04);
  _maxtime.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&_alpha,&parser.super_Group,(string *)&_file2,(string *)&_path,(Matcher *)&collimator,
             (double *)&_maxtime,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched)
  ;
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_beta);
  std::__cxx11::string::~string((string *)&_maxiter);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::string((string *)&_file2,"double",(allocator *)&_max_apertures);
  local_1490 = 1.0;
  std::__cxx11::to_string((string *)&_maxtime,1.0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_maxiter,
                 "Initial temperature for ratio  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_maxtime);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_maxiter,")")
  ;
  args::EitherFlag::EitherFlag((EitherFlag *)&_file,"beta");
  in_05._M_len = 1;
  in_05._M_array = (iterator)&_file;
  args::Matcher::Matcher((Matcher *)&collimator,in_05);
  _seed.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base = (_func_int **)0x0
  ;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&_beta,&parser.super_Group,(string *)&_file2,(string *)&_path,(Matcher *)&collimator,
             (double *)&_seed,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched)
  ;
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_maxiter);
  std::__cxx11::string::~string((string *)&_maxtime);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::string((string *)&_file2,"int",(allocator *)&_open_apertures);
  std::__cxx11::to_string((string *)&_seed,5000);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_maxtime,
                 "Number of iterations (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_seed);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_maxtime,")")
  ;
  args::EitherFlag::EitherFlag((EitherFlag *)&_file,"maxiter");
  in_06._M_len = 1;
  in_06._M_array = (iterator)&_file;
  args::Matcher::Matcher((Matcher *)&collimator,in_06);
  _max_apertures.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_maxiter,&parser.super_Group,(string *)&_file2,(string *)&_path,(Matcher *)&collimator
             ,(int *)&_max_apertures,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched)
  ;
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_maxtime);
  std::__cxx11::string::~string((string *)&_seed);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::string((string *)&_file2,"int",(allocator *)&_initial_intensity);
  std::__cxx11::to_string((string *)&_max_apertures,0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_seed,
                 "Maximum time in seconds (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_max_apertures);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_seed,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&_file,"maxtime");
  in_07._M_len = 1;
  in_07._M_array = (iterator)&_file;
  args::Matcher::Matcher((Matcher *)&collimator,in_07);
  _open_apertures.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0
  ;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_maxtime,&parser.super_Group,(string *)&_file2,(string *)&_path,(Matcher *)&collimator
             ,(int *)&_open_apertures,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched)
  ;
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_seed);
  std::__cxx11::string::~string((string *)&_max_apertures);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::string((string *)&_file2,"int",(allocator *)&_max_intensity);
  std::__cxx11::to_string((string *)&_open_apertures,(uint)tVar6);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_max_apertures,"Seed  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_open_apertures);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_max_apertures,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&_file,"seed");
  in_08._M_len = 1;
  in_08._M_array = (iterator)&_file;
  args::Matcher::Matcher((Matcher *)&collimator,in_08);
  _initial_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_
       = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_seed,&parser.super_Group,(string *)&_file2,(string *)&_path,(Matcher *)&collimator,
             (int *)&_initial_intensity,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched)
  ;
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_max_apertures);
  std::__cxx11::string::~string((string *)&_open_apertures);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::string((string *)&_file2,"int",(allocator *)&_step_intensity);
  local_1520 = 5;
  std::__cxx11::to_string((string *)&_initial_intensity,5);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_open_apertures,"Initial intensity for the station  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_initial_intensity);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_open_apertures,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&_file,"max-apertures");
  in_09._M_len = 1;
  in_09._M_array = (iterator)&_file;
  args::Matcher::Matcher((Matcher *)&collimator,in_09);
  _max_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_max_apertures,&parser.super_Group,(string *)&_file2,(string *)&_path,
             (Matcher *)&collimator,(int *)&_max_intensity,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched)
  ;
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_open_apertures);
  std::__cxx11::string::~string((string *)&_initial_intensity);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::string((string *)&_file2,"int",(allocator *)&_plot);
  std::__cxx11::to_string((string *)&_max_intensity,-1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_initial_intensity,"Number of initialized open apertures (-1: all, default:",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_max_intensity);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_initial_intensity,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&_file,"open-apertures");
  in_10._M_len = 1;
  in_10._M_array = (iterator)&_file;
  args::Matcher::Matcher((Matcher *)&collimator,in_10);
  _step_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0
  ;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_open_apertures,&parser.super_Group,(string *)&_file2,(string *)&_path,
             (Matcher *)&collimator,(int *)&_step_intensity,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched)
  ;
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_initial_intensity);
  std::__cxx11::string::~string((string *)&_max_intensity);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::string((string *)&_file2,"int",(allocator *)&w);
  std::__cxx11::to_string((string *)&_step_intensity,2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_max_intensity,"Initial value aperture intensity  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_step_intensity);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_max_intensity,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&_file,"initial-intensity");
  in_11._M_len = 1;
  in_11._M_array = (iterator)&_file;
  args::Matcher::Matcher((Matcher *)&collimator,in_11);
  _plot.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_initial_intensity,&parser.super_Group,(string *)&_file2,(string *)&_path,
             (Matcher *)&collimator,(int *)&_plot,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched)
  ;
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_max_intensity);
  std::__cxx11::string::~string((string *)&_step_intensity);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::string((string *)&_file2,"int",(allocator *)&Zmin);
  local_1524 = 0x1c;
  std::__cxx11::to_string((string *)&_plot,0x1c);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_step_intensity,"Max value aperture intensity  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_plot);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &_step_intensity,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&_file,"max-intensity");
  in_12._M_len = 1;
  in_12._M_array = (iterator)&_file;
  args::Matcher::Matcher((Matcher *)&collimator,in_12);
  w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_max_intensity,&parser.super_Group,(string *)&_file2,(string *)&_path,
             (Matcher *)&collimator,(int *)&w,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched)
  ;
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_step_intensity);
  std::__cxx11::string::~string((string *)&_plot);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::string((string *)&_file2,"int",(allocator *)&Zmax);
  std::__cxx11::to_string((string *)&w,2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_plot,
                 "Step size for aperture intensity  (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_plot,")");
  args::EitherFlag::EitherFlag((EitherFlag *)&_file,"step-intensity");
  in_13._M_len = 1;
  in_13._M_array = (iterator)&_file;
  args::Matcher::Matcher((Matcher *)&collimator,in_13);
  Zmin.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)Zmin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_ << 0x20);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&_step_intensity,&parser.super_Group,(string *)&_file2,(string *)&_path,
             (Matcher *)&collimator,(int *)&Zmin,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched)
  ;
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_plot);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::string((string *)&_file2,"bool",(allocator *)&w);
  std::__cxx11::string::string((string *)&_path,"Generate plot and save in file",(allocator *)&Zmin)
  ;
  args::EitherFlag::EitherFlag((EitherFlag *)&_file,"plot");
  in_14._M_len = 1;
  in_14._M_array = (iterator)&_file;
  args::Matcher::Matcher((Matcher *)&collimator,in_14);
  args::Flag::Flag(&_plot,&parser.super_Group,(string *)&_file2,(string *)&_path,
                   (Matcher *)&collimator,false);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched)
  ;
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::~string((string *)&_file2);
  std::__cxx11::string::string((string *)&_path,"string",(allocator *)&Zmax);
  std::__cxx11::string::string((string *)&w,"File with the deposition matrix",(allocator *)&volumes)
  ;
  args::EitherFlag::EitherFlag((EitherFlag *)&_file2,"file-dep");
  in_15._M_len = 1;
  in_15._M_array = (iterator)&_file2;
  args::Matcher::Matcher((Matcher *)&collimator,in_15);
  Zmin.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&Zmin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
  Zmin.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  Zmin.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag(&_file,&parser.super_Group,(string *)&_path,(string *)&w,(Matcher *)&collimator,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&Zmin,false);
  std::__cxx11::string::~string((string *)&Zmin);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_file2.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched
            );
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::~string((string *)&_path);
  std::__cxx11::string::string((string *)&w,"string",(allocator *)&volumes);
  std::__cxx11::string::string((string *)&Zmin,"File with the beam coordinates",&local_1525);
  args::EitherFlag::EitherFlag((EitherFlag *)&_path,"file-coord");
  in_16._M_len = 1;
  in_16._M_array = (iterator)&_path;
  args::Matcher::Matcher((Matcher *)&collimator,in_16);
  Zmax.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&Zmax.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
  Zmax.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  Zmax.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag(&_file2,&parser.super_Group,(string *)&w,(string *)&Zmin,(Matcher *)&collimator,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&Zmax,false);
  std::__cxx11::string::~string((string *)&Zmax);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)&_path.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.matched)
  ;
  std::__cxx11::string::~string((string *)&Zmin);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::string((string *)&Zmin,"string",&local_1525);
  std::__cxx11::string::string
            ((string *)&Zmax,
             "Absolute path of the executable (if it is executed from other directory)",&local_1519)
  ;
  args::EitherFlag::EitherFlag((EitherFlag *)&w,"path");
  in_17._M_len = 1;
  in_17._M_array = (iterator)&w;
  args::Matcher::Matcher((Matcher *)&collimator,in_17);
  volumes.super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&volumes.super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  volumes.super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  volumes.super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag(&_path,&parser.super_Group,(string *)&Zmin,(string *)&Zmax,(Matcher *)&collimator,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&volumes,false);
  std::__cxx11::string::~string((string *)&volumes);
  args::Matcher::~Matcher((Matcher *)&collimator);
  std::__cxx11::string::~string
            ((string *)
             &w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish);
  std::__cxx11::string::~string((string *)&Zmax);
  std::__cxx11::string::~string((string *)&Zmin);
  args::ArgumentParser::ParseCLI(&parser,argc,argv);
  (*_bsize.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  (**(code **)(CONCAT44(_vsize.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                        _vptr_Base._4_4_,
                        _vsize.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                        _vptr_Base._0_4_) + 0x10))();
  (**(code **)(CONCAT44(_maxdelta.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                        _vptr_Base._4_4_,
                        _maxdelta.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                        _vptr_Base._0_4_) + 0x10))();
  (**(code **)(CONCAT44(_maxratio.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                        _vptr_Base._4_4_,
                        _maxratio.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                        _vptr_Base._0_4_) + 0x10))();
  iVar2 = (*_alpha.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  if ((char)iVar2 != '\0') {
    local_1490 = _alpha.value;
  }
  (*_beta.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  cVar1 = (**(code **)(CONCAT44(_maxiter.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base._4_4_,
                                _maxiter.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base._0_4_) + 0x10))();
  iVar2 = 5000;
  if (cVar1 != '\0') {
    iVar2 = _maxiter.value;
  }
  iVar3 = (*_maxtime.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  iVar5 = 0;
  if ((char)iVar3 != '\0') {
    iVar5 = _maxtime.value;
  }
  cVar1 = (**(code **)(CONCAT44(_max_apertures.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base._4_4_,
                                _max_apertures.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base._0_4_) + 0x10))();
  if (cVar1 != '\0') {
    local_1520 = _max_apertures.value;
  }
  (**(code **)(CONCAT44(_open_apertures.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                        super_Base._vptr_Base._4_4_,
                        _open_apertures.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                        super_Base._vptr_Base._0_4_) + 0x10))();
  iVar3 = (*_seed.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  __seed = (uint)tVar6;
  if ((char)iVar3 != '\0') {
    __seed = _seed.value;
  }
  cVar1 = (**(code **)(CONCAT44(_initial_intensity.super_ValueFlagBase.super_FlagBase.
                                super_NamedBase.super_Base._vptr_Base._4_4_,
                                _initial_intensity.super_ValueFlagBase.super_FlagBase.
                                super_NamedBase.super_Base._vptr_Base._0_4_) + 0x10))();
  iVar3 = 2;
  if (cVar1 != '\0') {
    iVar3 = _initial_intensity.value;
  }
  cVar1 = (**(code **)(CONCAT44(_max_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base._4_4_,
                                _max_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base._0_4_) + 0x10))();
  if (cVar1 != '\0') {
    local_1524 = _max_intensity.value;
  }
  cVar1 = (**(code **)(CONCAT44(_step_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base._4_4_,
                                _step_intensity.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base._0_4_) + 0x10))();
  step_intensity = 2;
  if (cVar1 != '\0') {
    step_intensity = _step_intensity.value;
  }
  srand(__seed);
  cVar1 = (**(code **)(CONCAT62(_file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                                _vptr_Base._2_6_,
                                _file.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                                _vptr_Base._0_2_) + 0x10))();
  if (cVar1 != '\0') {
    std::__cxx11::string::_M_assign((string *)&file);
  }
  iVar4 = (*_file2.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  if ((char)iVar4 != '\0') {
    std::__cxx11::string::_M_assign((string *)&file2);
  }
  iVar4 = (*_path.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  if ((char)iVar4 != '\0') {
    std::__cxx11::string::_M_assign((string *)&path);
  }
  chdir(path._M_dataplus._M_p);
  poVar7 = std::operator<<((ostream *)&std::cout,
                           "##**************************************************************************"
                          );
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,
                           "##**************************************************************************"
                          );
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,
                           "##******** IMRT-Solver (Ant Colony Optimization) *********");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,
                           "##**************************************************************************"
                          );
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,
                           "##**************************************************************************"
                          );
  std::endl<char,std::char_traits<char>>(poVar7);
  collimator.beam_coord._M_t._M_impl._0_8_ = 0x3ff0000000000000;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3ff00000;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x3ff0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&collimator;
  std::vector<double,_std::allocator<double>_>::vector(&w,__l,(allocator_type *)&Zmin);
  collimator.beam_coord._M_t._M_impl._0_8_ = 0;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x4053000000000000;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&collimator;
  std::vector<double,_std::allocator<double>_>::vector(&Zmin,__l_00,(allocator_type *)&Zmax);
  collimator.beam_coord._M_t._M_impl._0_8_ = 0x4050400000000000;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x404e0000;
  collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x408f400000000000;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&collimator;
  std::vector<double,_std::allocator<double>_>::vector(&Zmax,__l_01,(allocator_type *)&volumes);
  std::__cxx11::string::string((string *)&local_f10,(string *)&file2);
  std::__cxx11::string::string((string *)&local_f30,(string *)&file);
  get_angles((set<int,_std::less<int>,_std::allocator<int>_> *)&local_d40,&local_f30,n);
  imrt::Collimator::Collimator
            (&collimator,&local_f10,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_d40);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_d40);
  std::__cxx11::string::~string((string *)&local_f30);
  std::__cxx11::string::~string((string *)&local_f10);
  std::__cxx11::string::string((string *)&local_f50,(string *)&file);
  createVolumes(&volumes,&local_f50,&collimator);
  std::__cxx11::string::~string((string *)&local_f50);
  poVar7 = std::operator<<((ostream *)&std::cout,"##");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,
                           "##**************************************************************************"
                          );
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,
                           "##*********************************** INFO *********************************"
                          );
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,
                           "##**************************************************************************"
                          );
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"##");
  poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<(poVar7,"## Solver: ");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"##   Iterations: ");
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar2);
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"##   Time: ");
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar5);
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"##   Seed: ");
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,__seed);
  std::endl<char,std::char_traits<char>>(poVar7);
  std::operator<<((ostream *)&std::cout,"##   alpha: ");
  poVar7 = std::ostream::_M_insert<double>(local_1490);
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"##   Initial intensity: ");
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar3);
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"##   Max intensity: ");
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,local_1524);
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"##   Step intensity: ");
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,step_intensity);
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"##");
  poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<(poVar7,"## Colimator configuration: ");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"##   Stations: ");
  iVar2 = imrt::Collimator::getNbAngles(&collimator);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar2);
  std::endl<char,std::char_traits<char>>(poVar7);
  std::operator<<((ostream *)&std::cout,"##   Angles: ");
  iVar2 = 0;
  while( true ) {
    iVar5 = imrt::Collimator::getNbAngles(&collimator);
    if (iVar5 <= iVar2) break;
    iVar5 = imrt::Collimator::getAngle(&collimator,iVar2);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
    std::operator<<(poVar7," ");
    iVar2 = iVar2 + 1;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar7 = std::operator<<((ostream *)&std::cout,"##   Apertures: ");
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,local_1520);
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"##");
  poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<(poVar7,"## Instance information: ");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"##   Volumes: ");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"##");
  poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<(poVar7,
                           "##**************************************************************************"
                          );
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,
                           "##********************************** SEARCH ********************************"
                          );
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,
                           "##**************************************************************************"
                          );
  std::endl<char,std::char_traits<char>>(poVar7);
  imrt::Collimator::generateReference(&collimator);
  imrt::Collimator::generateIntensityLevels(&collimator,step_intensity,local_1524);
  this = (ACS *)operator_new(0x118);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_fa8,&w);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_fc0,&Zmin);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_fd8,&Zmax);
  imrt::ACS::ACS(this,(vector<double,_std::allocator<double>_> *)&local_fa8,
                 (vector<double,_std::allocator<double>_> *)&local_fc0,
                 (vector<double,_std::allocator<double>_> *)&local_fd8,&collimator,&volumes,
                 local_1520,local_1524,iVar3,step_intensity,10,1.0,2.0,2.0,0.2);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_fd8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_fc0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_fa8);
  (*(this->super_ACO)._vptr_ACO[4])(this,900);
  poVar7 = std::operator<<((ostream *)&std::cout,
                           "##**************************************************************************"
                          );
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,
                           "##******************************* RESULTS **********************************"
                          );
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,
                           "##**************************************************************************"
                          );
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"##");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::~vector(&volumes);
  imrt::Collimator::~Collimator(&collimator);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&Zmax.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&Zmin.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&w.super__Vector_base<double,_std::allocator<double>_>);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag(&_path);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag(&_file2);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag(&_file);
  args::FlagBase::~FlagBase(&_plot.super_FlagBase);
  args::FlagBase::~FlagBase((FlagBase *)&_step_intensity);
  args::FlagBase::~FlagBase((FlagBase *)&_max_intensity);
  args::FlagBase::~FlagBase((FlagBase *)&_initial_intensity);
  args::FlagBase::~FlagBase((FlagBase *)&_open_apertures);
  args::FlagBase::~FlagBase((FlagBase *)&_max_apertures);
  args::FlagBase::~FlagBase((FlagBase *)&_seed);
  args::FlagBase::~FlagBase((FlagBase *)&_maxtime);
  args::FlagBase::~FlagBase((FlagBase *)&_maxiter);
  args::FlagBase::~FlagBase((FlagBase *)&_beta);
  args::FlagBase::~FlagBase((FlagBase *)&_alpha);
  args::FlagBase::~FlagBase((FlagBase *)&_maxratio);
  args::FlagBase::~FlagBase((FlagBase *)&_maxdelta);
  args::FlagBase::~FlagBase((FlagBase *)&_vsize);
  args::FlagBase::~FlagBase((FlagBase *)&_bsize);
  args::FlagBase::~FlagBase((FlagBase *)&help);
  args::ArgumentParser::~ArgumentParser(&parser);
  std::__cxx11::string::~string((string *)&path);
  std::__cxx11::string::~string((string *)&file2);
  std::__cxx11::string::~string((string *)&file);
  return 0;
}

Assistant:

int main(int argc, char** argv){

  int vsize=50;
  int bsize=20;
  int maxiter=5000;
  int maxtime=0;
  int max_apertures=5;
  int open_apertures=-1;
  double alpha=1.0;
  double beta=1.0;
  double maxdelta=5.0;
  double maxratio=3.0;

  //bool search_aperture=false;
  //bool search_intensity=false;
  //string strategy="dao_ls";
  //int ls_type=ApertureILS::FIRST_IMPROVEMENT;

  int initial_intensity=2;
  int max_intensity=28;
  int step_intensity=2;
  
  //bool acceptance=ILS::ACCEPT_NONE;
  //int initial_setup;

  // ls params
  //double prob_intensity=0.2;
  //double temperature, initial_temperature=10;
  //double min_temperature=0;
  //double alphaT=0.95;
  //int perturbation=2;

  string file="data/testinstance_0_70_140_210_280.txt";
  string file2="data/test_instance_coordinates.txt";
  string path=".";
  int seed=time(NULL);

  // Tabu list <<beam,station*>, open> for intensity
  //vector<pair<pair<int,Station*>,  bool > > tabu_list_inten;
  // Tabu list <<beam,station*>, <aperture,open>> for aperture
  //vector<pair<pair<int,Station*>, pair<int, bool> > > tabu_list_aper;
  //int tabusize=10;


  args::ArgumentParser parser("********* IMRT-Solver (ACO solver) *********", "Example.\n./ACO -s ibo_ls --maxiter=400 --maxdelta=8 --maxratio=6 --alpha=0.999 --beta=0.999 --bsize=5 --vsize=20 --max-apertures=4 --seed=0 --open-apertures=1 --initial-intensity=4 --step-intensity=1 --file-dep=data/Equidistantes/equidist00.txt --file-coord=data/Equidistantes/equidist-coord.txt");
  args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
  //args::ValueFlag<string> _format(parser, "string", "Format: (BR, BRw, 1C)", {'f'});
  //args::ValueFlag<string> _strategy(parser, "string", "Strategy  (dao_ls|ibo_ls)", {'s', "strategy"});
  args::ValueFlag<int> _bsize(parser, "int", "Number of considered beamlets for selection ("+to_string(bsize)+")", {"bsize"});
  args::ValueFlag<int> _vsize(parser, "int", "Number of considered worst voxels ("+to_string(vsize)+")", {"vsize"});
  // args::ValueFlag<int> _int0(parser, "int", "Initial intensity for beams  ("+to_string(int0)+")", {"int0"});
  args::ValueFlag<int> _maxdelta(parser, "int", "Max delta  ("+to_string(maxdelta)+")", {"maxdelta"});
  args::ValueFlag<int> _maxratio(parser, "int", "Max ratio  ("+to_string(maxratio)+")", {"maxratio"});
  args::ValueFlag<double> _alpha(parser, "double", "Initial temperature for intensities  ("+to_string(alpha)+")", {"alpha"});
  args::ValueFlag<double> _beta(parser, "double", "Initial temperature for ratio  ("+to_string(beta)+")", {"beta"});
  args::ValueFlag<int> _maxiter(parser, "int", "Number of iterations ("+to_string(maxiter)+")", {"maxiter"});
  args::ValueFlag<int> _maxtime(parser, "int", "Maximum time in seconds ("+to_string(maxtime)+")", {"maxtime"});
  args::ValueFlag<int> _seed(parser, "int", "Seed  ("+to_string(seed)+")", {"seed"});

  args::ValueFlag<int> _max_apertures(parser, "int", "Initial intensity for the station  ("+to_string(max_apertures)+")", {"max-apertures"});
  args::ValueFlag<int> _open_apertures(parser, "int", "Number of initialized open apertures (-1: all, default:"+to_string(open_apertures)+")", {"open-apertures"});
  args::ValueFlag<int> _initial_intensity(parser, "int", "Initial value aperture intensity  ("+to_string(initial_intensity)+")", {"initial-intensity"});
  args::ValueFlag<int> _max_intensity(parser, "int", "Max value aperture intensity  ("+to_string(max_intensity)+")", {"max-intensity"});
  args::ValueFlag<int> _step_intensity(parser, "int", "Step size for aperture intensity  ("+to_string(step_intensity)+")", {"step-intensity"});

  //args::Group setup (parser, "Initial solution setup (these override all provided configurations):", args::Group::Validators::DontCare);
  //args::Flag open_max(setup, "open_max", "Open aperture setup with max intensity", {"open-max-setup"});
  //args::Flag open_min(setup, "open_min", "Open aperture setup with min intensity", {"open-min-setup"});
  //args::Flag closed_min(setup, "closed_min", "Closed aperture setup with min intensity", {"closed-min-setup"});
  //args::Flag closed_max(setup, "closed_max", "Closed aperture setup with max intensity", {"closed-max-setup"});
  //args::Flag all_rand(setup, "all_rand", "Random aperture setup with random intensity", {"rand-setup"});

  //args::Group dao_ls (parser, "Direct aperture local search:", args::Group::Validators::DontCare);
  //args::Flag ls_aperture(dao_ls, "ls_apertures", "Apply aperture local search", {"ls-aperture"});
  //args::Flag ls_intensity(dao_ls, "ls_intensity", "Apply intensity local search", {"ls-intensity"});
  //args::ValueFlag<double> _prob_intensity(dao_ls, "double", "Probability to search over intensity  ("+to_string(prob_intensity)+")", {"prob-intensity"});
  //args::Flag best_improv(dao_ls, "best_improv", "Apply best improvement when searching intensity or apertures", {"best-improvement"});
  //args::Flag first_improv(dao_ls, "first_improv", "Apply first improvement when searching intensity or apertures", {"first-improvement"});
  //args::Flag do_perturbate(dao_ls, "do_perturbate", "Perturbate after a selected criterion is triggered", {"perturbate"});

  //args::Group accept (parser, "Acceptance criterion:", args::Group::Validators::AtMostOne);
  //args::Flag accept_best(accept, "accept-best", "Accept only improvement", {"accept-best"});
  //args::Flag accept_sa(accept, "accept-sa", "Accept as simulated annealing", {"accept-sa"});

  //args::ValueFlag<double> _temperature(parser, "double", "Temperature for acceptance criterion  ("+to_string(temperature)+")", {"temperature"});
  //args::ValueFlag<double> _alphaT(parser, "double", "Reduction rate of the temperature  ("+to_string(alphaT)+")", {"alphaT"});
  //args::ValueFlag<int> _perturbation(parser, "int", "Perturbation size  ("+to_string(perturbation)+")", {"perturbation-size"});

  args::Flag _plot(parser, "bool", "Generate plot and save in file", {"plot"});
  //args::Flag trace(parser, "trace", "Trace", {"trace"});
  args::ValueFlag<string> _file(parser, "string", "File with the deposition matrix", {"file-dep"});
  args::ValueFlag<string> _file2(parser, "string", "File with the beam coordinates", {"file-coord"});
  args::ValueFlag<string> _path(parser, "string", "Absolute path of the executable (if it is executed from other directory)", {"path"});

	try
	{
		parser.ParseCLI(argc, argv);

	}
	catch (args::Help&)
	{
		std::cout << parser;
		return 0;
	}
	catch (args::ParseError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}
	catch (args::ValidationError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}

  //if(_strategy) strategy=_strategy.Get();
  if(_bsize) bsize=_bsize.Get();
  if(_vsize) vsize=_vsize.Get();
  if(_maxdelta) maxdelta=_maxdelta.Get();
  if(_maxratio) maxratio=_maxratio.Get();
  if(_alpha) alpha=_alpha.Get();
  if(_beta) beta=_beta.Get();
  if(_maxiter) maxiter=_maxiter.Get();
  if(_maxtime) maxtime=_maxtime.Get();
  if(_max_apertures) max_apertures=_max_apertures.Get();
  if(_open_apertures) open_apertures=_open_apertures.Get();
  if(_seed) seed=_seed.Get();
  if(_initial_intensity) initial_intensity=_initial_intensity.Get();
  if(_max_intensity) max_intensity=_max_intensity.Get();
  if(_step_intensity) step_intensity=_step_intensity.Get();
  //if(_prob_intensity) prob_intensity=_prob_intensity.Get();
  //if(_temperature) temperature=initial_temperature=_temperature.Get();
  //if(_alphaT) alphaT=_alphaT.Get();
  //if (ls_aperture) search_aperture=true;
  //if (ls_intensity) search_intensity=true;
  //if(!ls_aperture && !ls_intensity){
  //  search_aperture=true;
  //  search_intensity=true;
  //}
  //if (first_improv) ls_type=ApertureILS::FIRST_IMPROVEMENT;
  //if (best_improv) ls_type=ApertureILS::BEST_IMPROVEMENT;
  //if (accept_sa) acceptance=ILS::ACCEPT_SA;
  //if (accept_best) acceptance=ILS::ACCEPT_NONE;
  //if (_perturbation) perturbation=_perturbation.Get();

  srand(seed);

  //This should be at the end given that will modify values
  /*if(open_max) {
    initial_setup=Station::OPEN_MAX_SETUP;
    initial_intensity=max_intensity;
  } else if (open_min) {
    initial_setup=Station::OPEN_MIN_SETUP;
    initial_intensity=0;
  } else if (closed_min) {
    initial_setup=Station::CLOSED_MIN_SETUP;
    initial_intensity=0;
  } else if (closed_max) {
    initial_setup=Station::CLOSED_MAX_SETUP;
    initial_intensity=max_intensity;
  } else if (all_rand) {
    if(strategy=="dao_ls")
      initial_setup=Station::RAND_RAND_SETUP;
    else if (strategy=="ibo_ls")
      initial_setup=Station::RAND_INTENSITIES;
 }  else {
    initial_setup=Station::MANUAL_SETUP;
 }*/
    
  if (_file) file=_file.Get();
  if (_file2) file2=_file2.Get();
  if (_path) path=_path.Get();

  chdir(path.c_str());

  cout << "##**************************************************************************"<< endl;
  cout << "##**************************************************************************"<< endl;
  //if(strategy=="dao_ls")
    cout << "##******** IMRT-Solver (Ant Colony Optimization) *********"<< endl;
  //else if(strategy=="ibo_ls")
  //  cout << "##******** IMRT-Solver (Intensity-based Optimization Local Search) *********"<< endl;
  cout << "##**************************************************************************"<< endl;
  cout << "##**************************************************************************"<< endl;

  vector<double> w={1,1,1};
  vector<double> Zmin={0,0,76};
  vector<double> Zmax={65,60,1000};

  Collimator collimator(file2, get_angles(file, 5));
  vector<Volume> volumes= createVolumes (file, collimator);

  //Plan P(w, Zmin, Zmax, collimator, volumes, max_apertures, max_intensity, initial_intensity, step_intensity, open_apertures, initial_setup);

  //double best_eval=P.getEvaluation();

  cout << "##" << endl;
  cout << "##**************************************************************************"<< endl;
  cout << "##*********************************** INFO *********************************"<< endl;
  cout << "##**************************************************************************"<< endl;
  cout << "##" << endl << "## Solver: "<< endl;
  cout << "##   Iterations: " << maxiter << endl;
  cout << "##   Time: " << maxtime << endl;
  cout << "##   Seed: " << seed << endl;
  //cout << "##   Temperature: " << temperature << endl;
  cout << "##   alpha: " << alpha << endl;
  //if (search_aperture)
  //  cout << "##   Searching: aperture pattern" << endl;
  //if (search_intensity)
  //  cout << "##   Searching: intensity" << endl;
  //cout << "##   Probability intensity ls: " << prob_intensity << endl;
  //if (strategy=="dao_ls" && ls_type==ApertureILS::FIRST_IMPROVEMENT)
  //  cout << "##   Local search: first improvement"  << endl;
  //if (strategy=="dao_ls" && ls_type==ApertureILS::BEST_IMPROVEMENT)
  //  cout << "##   Local search: best improvement"  << endl;
  //cout << "##   Open initial setup: " ;
  //if (initial_setup==Station::OPEN_MAX_SETUP) cout << "open max intensity" << endl;
  //else if (initial_setup==Station::OPEN_MIN_SETUP) cout << "open min intensity" << endl;
  //else if (initial_setup==Station::CLOSED_MAX_SETUP) cout << "closed max intensity" << endl;
  //else if (initial_setup==Station::CLOSED_MIN_SETUP) cout << "closed min intensity" << endl;
  //else if (initial_setup==Station::RAND_RAND_SETUP) cout << "random" << endl;
  //else if (initial_setup==Station::RAND_INTENSITIES) cout << "random" << endl;
  //else cout << "manual, " << open_apertures << " open apertures" << endl;
  
  cout << "##   Initial intensity: " << initial_intensity << endl;
  cout << "##   Max intensity: " << max_intensity << endl;
  cout << "##   Step intensity: " << step_intensity << endl;
  //cout << "##   Perturbation size: " << perturbation << endl;
  
  cout << "##" << endl << "## Colimator configuration: "<< endl;
  cout << "##   Stations: " << collimator.getNbAngles() << endl;
  cout << "##   Angles: ";
  for (int i=0; i<collimator.getNbAngles();i++) cout << collimator.getAngle(i) << " ";
  cout << endl;
  cout << "##   Apertures: " << max_apertures << endl;


  cout << "##" << endl << "## Instance information: "<< endl;
  cout << "##   Volumes: " << volumes.size() << endl;

  cout << "##" << endl << "##**************************************************************************"<< endl;
  cout << "##********************************** SEARCH ********************************"<< endl;
  cout << "##**************************************************************************"<< endl;



  //cout << "## Initial solution: " << best_eval << endl;
  //cout  << "##" << endl;

  collimator.generateReference ();
  collimator.generateIntensityLevels (step_intensity,max_intensity);
  //collimator.printReference ();

  ACO* aco = new ACS(w, Zmin, Zmax, collimator, volumes, max_apertures, max_intensity, initial_intensity, step_intensity,10, 1, 2, 2, 0.2);
  aco->search(900);
  //aco->evaporation();
  //aco->printPheromone();
  //aco->printAnts();
  //aco->generateTours();
  //aco->printAnts();
  
  
  //if(strategy=="dao_ls")
   // ils = new ApertureILS(bsize, vsize, search_intensity, search_aperture,
   //                       prob_intensity, step_intensity, initial_temperature,
   //                       alphaT, do_perturbate, perturbation, acceptance, ls_type);
  //else if(strategy=="ibo_ls")
    //ils = new IntensityILS(step_intensity, bsize, vsize, maxdelta, maxratio, alpha, beta, perturbation);

  //ils-> notTargetedSearch(P, maxtime, maxiter);


  cout << "##**************************************************************************"<< endl;
  cout << "##******************************* RESULTS **********************************"<< endl;
  cout << "##**************************************************************************"<< endl;
  cout << "##"<<endl;
  
 // cout << "## Best solution found: " <<  P.getEvaluation() << endl;
  //cout <<  P.getEvaluation() << " ";

 /* const list<Station*> stations=P.get_stations();

  int tot_alpha=0;
  for(auto s:stations){
    int alpha=s->get_sum_alpha(strategy);
    cout << alpha << " " ;
    tot_alpha+=alpha;
  }
  cout << tot_alpha << " ";

  int nb_apertures=0;
  for(auto s:stations){
    int ap=s->get_nb_apertures(strategy);
    cout << ap << " " ;
    nb_apertures+=ap;
  }
  cout << nb_apertures << endl;*/


	/*cout << endl;
	for(int i=0;i<5;i++)
		P.printIntensity(i);

	cout << endl;
  */

/*
	cout << "********   Summary of the results    *********"<< endl;
	best_eval = F.eval(P,w,Zmin,Zmax);
	cout << "Final solution: " << best_eval << endl << endl;

  F.generate_voxel_dose_functions ();
  */
  /*set<int> l = get_angles(file, 5);
  if(_plot){
	  std::stringstream ss;
	  ss << "python plotter/plot.py " << *l.begin()/5 << "_" << strategy << "_" << initial_intensity << "_" << initial_setup << "_" << maxtime << "_" << seed <<".pdf";
	  std::string s = ss.str();
	  system(s.c_str());
  }
*/
	return 0;

}